

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::TempVar::freeIdx(TempVar *this)

{
  ulong uVar1;
  iterator __position;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  key_type local_1c;
  
  uVar1 = (this->ty).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  local_1c = (key_type)uVar1;
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            std::__detail::
            _Map_base<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->pass->freeTemps,&local_1c);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                    (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),this);
  __position._M_current = *(uint **)(this_00 + 8);
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current == *(uint **)(this_00 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this_00,__position,&this->idx);
    }
    else {
      *__position._M_current = this->idx;
      *(uint **)(this_00 + 8) = __position._M_current + 1;
    }
    return;
  }
  __assert_fail("std::find(freeList.begin(), freeList.end(), idx) == freeList.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x58,"void wasm::I64ToI32Lowering::TempVar::freeIdx()");
}

Assistant:

void freeIdx() {
      auto& freeList = pass.freeTemps[ty.getBasic()];
      assert(std::find(freeList.begin(), freeList.end(), idx) ==
             freeList.end());
      freeList.push_back(idx);
    }